

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkConverLatchNamesIntoNumbers(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void *pvVar2;
  long *plVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Int_t *p;
  int *__ptr;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  Vec_Ptr_t *pVVar12;
  long lVar13;
  Vec_Ptr_t *pVVar14;
  ulong local_38;
  
  pVVar12 = pNtk->vOnehots;
  if (pVVar12 == (Vec_Ptr_t *)0x0) {
    pVVar5 = (Vec_Ptr_t *)0x0;
  }
  else {
    pVVar14 = pNtk->vBoxes;
    uVar4 = pVVar14->nSize;
    if (0 < (long)(int)uVar4) {
      ppvVar6 = pVVar14->pArray;
      lVar9 = 0;
      do {
        if ((*(uint *)((long)ppvVar6[lVar9] + 0x14) & 0xf) == 8) {
          *(long *)((long)ppvVar6[lVar9] + 8) = lVar9;
        }
        lVar9 = lVar9 + 1;
      } while ((int)uVar4 != lVar9);
    }
    uVar1 = pVVar12->nSize;
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    local_38 = 8;
    if (6 < uVar1 - 1) {
      local_38 = (ulong)uVar1;
    }
    pVVar5->nSize = 0;
    iVar7 = (int)local_38;
    pVVar5->nCap = iVar7;
    if (iVar7 == 0) {
      ppvVar6 = (void **)0x0;
    }
    else {
      ppvVar6 = (void **)malloc((long)iVar7 << 3);
    }
    pVVar5->pArray = ppvVar6;
    if (0 < (int)uVar1) {
      iVar7 = 0;
      lVar9 = 0;
      do {
        pvVar2 = pVVar12->pArray[lVar9];
        iVar11 = *(int *)((long)pvVar2 + 4);
        p = (Vec_Int_t *)malloc(0x10);
        iVar8 = iVar11;
        if (iVar11 - 1U < 0xf) {
          iVar8 = 0x10;
        }
        p->nSize = 0;
        p->nCap = iVar8;
        if (iVar8 == 0) {
          __ptr = (int *)0x0;
        }
        else {
          __ptr = (int *)malloc((long)iVar8 << 2);
        }
        p->pArray = __ptr;
        if (iVar11 < 1) {
LAB_008711d6:
          if (__ptr != (int *)0x0) {
            free(__ptr);
          }
          free(p);
        }
        else {
          lVar13 = 0;
          do {
            uVar4 = Nm_ManFindIdByName(pNtk->pManName,
                                       *(char **)(*(long *)((long)pvVar2 + 8) + lVar13 * 8),5);
            if (-1 < (int)uVar4) {
              if (pNtk->vObjs->nSize <= (int)uVar4) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              plVar3 = (long *)pNtk->vObjs->pArray[uVar4];
              if ((*(int *)((long)plVar3 + 0x1c) == 1) &&
                 ((*(uint *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                      (long)*(int *)plVar3[4] * 8) + 0x14) & 0xf) == 8)) {
                Vec_IntPush(p,(int)plVar3[1]);
              }
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < *(int *)((long)pvVar2 + 4));
          if (p->nSize < 2) {
            __ptr = p->pArray;
            goto LAB_008711d6;
          }
          iVar11 = (int)local_38;
          if (iVar7 == iVar11) {
            if (iVar11 < 0x10) {
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
              }
              pVVar5->pArray = ppvVar6;
              pVVar5->nCap = 0x10;
              local_38 = 0x10;
            }
            else {
              local_38 = (ulong)(uint)(iVar11 * 2);
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(local_38 * 8);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar5->pArray,local_38 * 8);
              }
              pVVar5->pArray = ppvVar6;
              pVVar5->nCap = iVar11 * 2;
            }
          }
          else {
            ppvVar6 = pVVar5->pArray;
          }
          pVVar5->nSize = iVar7 + 1;
          ppvVar6[iVar7] = p;
          printf("Converted %d one-hot registers.\n",(ulong)(uint)p->nSize);
          iVar7 = iVar7 + 1;
        }
        lVar9 = lVar9 + 1;
        pVVar12 = pNtk->vOnehots;
      } while (lVar9 < pVVar12->nSize);
      pVVar14 = pNtk->vBoxes;
      uVar4 = pVVar14->nSize;
    }
    if (0 < (int)uVar4) {
      ppvVar6 = pVVar14->pArray;
      uVar10 = 0;
      do {
        if ((*(uint *)((long)ppvVar6[uVar10] + 0x14) & 0xf) == 8) {
          *(undefined8 *)((long)ppvVar6[uVar10] + 8) = 0;
        }
        uVar10 = uVar10 + 1;
      } while (uVar4 != uVar10);
    }
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Abc_NtkConverLatchNamesIntoNumbers( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vResult, * vNames;
    Vec_Int_t * vNumbers;
    Abc_Obj_t * pObj;
    char * pName;
    int i, k, Num;
    if ( pNtk->vOnehots == NULL )
        return NULL;
    // set register numbers
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    // add the numbers
    vResult = Vec_PtrAlloc( Vec_PtrSize(pNtk->vOnehots) );
    Vec_PtrForEachEntry( Vec_Ptr_t *, pNtk->vOnehots, vNames, i )
    {
        vNumbers = Vec_IntAlloc( Vec_PtrSize(vNames) );
        Vec_PtrForEachEntry( char *, vNames, pName, k )
        {
            Num = Nm_ManFindIdByName( pNtk->pManName, pName, ABC_OBJ_BO );
            if ( Num < 0 )
                continue;
            pObj = Abc_NtkObj( pNtk, Num );
            if ( Abc_ObjFaninNum(pObj) != 1 || !Abc_ObjIsLatch(Abc_ObjFanin0(pObj)) )
                continue;
            Vec_IntPush( vNumbers, (int)(ABC_PTRINT_T)pObj->pNext );
        }
        if ( Vec_IntSize( vNumbers ) > 1 )
        {
            Vec_PtrPush( vResult, vNumbers );
printf( "Converted %d one-hot registers.\n", Vec_IntSize(vNumbers) );
        }
        else
            Vec_IntFree( vNumbers );
    }
    // clean the numbers
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pNext = NULL;
    return vResult;
}